

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O2

_Bool upb_strtable_next2(upb_strtable *t,upb_StringView *key,upb_value *val,intptr_t *iter)

{
  uint uVar1;
  upb_tabent *puVar2;
  upb_SizePrefixString *puVar3;
  size_t sVar4;
  ulong uVar5;
  
  sVar4 = next(&t->t,*iter);
  uVar5 = (ulong)((t->t).mask + 1);
  if (sVar4 < uVar5) {
    puVar2 = (t->t).entries;
    puVar3 = puVar2[sVar4].key.str;
    uVar1 = puVar3->size;
    key->data = (char *)(puVar3 + 1);
    key->size = (ulong)uVar1;
    val->val = puVar2[sVar4].val.val;
    *iter = sVar4;
  }
  return sVar4 < uVar5;
}

Assistant:

bool upb_strtable_next2(const upb_strtable* t, upb_StringView* key,
                        upb_value* val, intptr_t* iter) {
  size_t tab_idx = next(&t->t, *iter);
  if (tab_idx < upb_table_size(&t->t)) {
    upb_tabent* ent = &t->t.entries[tab_idx];
    *key = upb_key_strview(ent->key);
    *val = ent->val;
    *iter = tab_idx;
    return true;
  }

  return false;
}